

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall
FIX::Message::setGroup
          (Message *this,string *msg,FieldBase *field,string *string,size_type *pos,FieldMap *map,
          DataDictionary *dataDictionary)

{
  int field_00;
  ulong uVar1;
  int delim_00;
  int field_01;
  bool bVar2;
  Group *pGroup;
  message_order *order;
  int delim;
  DataDictionary *pDD;
  FieldMap *local_a8;
  Message *local_a0;
  string *local_98;
  FieldBase field_1;
  
  field_00 = field->m_tag;
  pDD = (DataDictionary *)0x0;
  local_a8 = map;
  local_a0 = this;
  local_98 = msg;
  bVar2 = DataDictionary::getGroup(dataDictionary,msg,field_00,&delim,&pDD);
  if (bVar2) {
    pGroup = (Group *)0x0;
    while (uVar1 = *pos, uVar1 < string->_M_string_length) {
      extractField(&field_1,local_a0,string,pos,dataDictionary,dataDictionary,pGroup);
      if (field_1.m_tag == delim) {
        if (pGroup != (Group *)0x0) {
LAB_001901bb:
          FieldMap::addGroupPtr(local_a8,field_00,&pGroup->super_FieldMap,false);
        }
LAB_001901d1:
        pGroup = (Group *)operator_new(0x78);
        field_01 = field_1.m_tag;
        delim_00 = delim;
        order = DataDictionary::getOrderedFields(pDD);
        Group::Group(pGroup,field_01,delim_00,order);
      }
      else {
        bVar2 = DataDictionary::isField(pDD,field_1.m_tag);
        if (bVar2) {
          if (pGroup == (Group *)0x0) goto LAB_001901d1;
          bVar2 = FieldMap::isSetField(&pGroup->super_FieldMap,field_1.m_tag);
          if (bVar2) goto LAB_001901bb;
        }
        bVar2 = DataDictionary::isField(pDD,field_1.m_tag);
        if (!bVar2) {
          if (pGroup != (Group *)0x0) {
            FieldMap::addGroupPtr(local_a8,field_00,&pGroup->super_FieldMap,false);
          }
          *pos = uVar1;
LAB_001902ab:
          FieldBase::~FieldBase(&field_1);
          return;
        }
        if (pGroup == (Group *)0x0) goto LAB_001902ab;
      }
      FieldMap::addField(&pGroup->super_FieldMap,&field_1);
      setGroup(local_a0,local_98,&field_1,string,pos,&pGroup->super_FieldMap,pDD);
      FieldBase::~FieldBase(&field_1);
    }
    if (pGroup != (Group *)0x0) {
      (*(pGroup->super_FieldMap)._vptr_FieldMap[1])(pGroup);
    }
  }
  return;
}

Assistant:

void Message::setGroup( const std::string& msg, const FieldBase& field,
                        const std::string& string,
                        std::string::size_type& pos, FieldMap& map,
                        const DataDictionary& dataDictionary )
{
  int group = field.getTag();
  int delim;
  const DataDictionary* pDD = 0;
  if ( !dataDictionary.getGroup( msg, group, delim, pDD ) ) return ;
  SmartPtr<Group> pGroup;

  while ( pos < string.size() )
  {
    std::string::size_type oldPos = pos;
    FieldBase field = extractField( string, pos, &dataDictionary, &dataDictionary, pGroup.get() );
       
    // Start a new group because...
    if (// found delimiter
    (field.getTag() == delim) ||
    // no delimiter, but field belongs to group OR field already processed
    (pDD->isField( field.getTag() ) && (pGroup.get() == 0 || pGroup->isSetField( field.getTag() )) ))
    {
      if ( pGroup.get() )
      {
        map.addGroupPtr( group, pGroup.release(), false );
      }
      pGroup.reset( new Group( field.getTag(), delim, pDD->getOrderedFields() ) );
    }
    else if ( !pDD->isField( field.getTag() ) )
    {
      if ( pGroup.get() )
      {
        map.addGroupPtr( group, pGroup.release(), false );
      }
      pos = oldPos;
      return ;
    }

    if ( !pGroup.get() ) return ;
    pGroup->addField( field );
    setGroup( msg, field, string, pos, *pGroup, *pDD );
  }
}